

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::SumNoOverflowDeserialize
          (duckdb *this,Deserializer *deserializer,AggregateFunction *function)

{
  LogicalType *pLVar1;
  
  pLVar1 = Deserializer::Get<duckdb::LogicalType_const&>(deserializer);
  if (&(function->super_BaseScalarFunction).return_type != pLVar1) {
    (function->super_BaseScalarFunction).return_type.id_ = pLVar1->id_;
    (function->super_BaseScalarFunction).return_type.physical_type_ = pLVar1->physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&(function->super_BaseScalarFunction).return_type.type_info_,&pLVar1->type_info_);
  }
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> SumNoOverflowDeserialize(Deserializer &deserializer, AggregateFunction &function) {
	function.return_type = deserializer.Get<const LogicalType &>();
	return nullptr;
}